

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_relayer.cpp
# Opt level: O3

void __thiscall TcpRelayer::onAccept(TcpRelayer *this,Connection *conn)

{
  _Atomic_word *p_Var1;
  __suseconds_t _Var2;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  TcpClient *this_00;
  undefined8 uVar4;
  int iVar5;
  TimerId TVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  RelayerContext context;
  shared_ptr<Liby::TcpClient> tcpClient;
  undefined1 local_88 [16];
  _Manager_type local_78;
  _Invoker_type p_Stack_70;
  Timestamp local_68;
  __weak_count<(__gnu_cxx::_Lock_policy)2> _Stack_58;
  TcpClient *local_50;
  _Any_data local_48;
  
  Liby::EventLoopGroup::creatTcpClient
            ((EventLoopGroup *)&local_50,(string *)this->group_,&this->host_);
  uVar4 = local_48._M_unused._0_8_;
  this_00 = local_50;
  local_68.tv_.tv_sec = 8;
  local_68.tv_.tv_usec = 0;
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_unused._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_48._M_unused._M_function_pointer + 8) =
           *(int *)(local_48._M_unused._M_function_pointer + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_48._M_unused._M_function_pointer + 8) =
           *(int *)(local_48._M_unused._M_function_pointer + 8) + 1;
    }
  }
  local_78 = (_Manager_type)0x0;
  p_Stack_70 = (_Invoker_type)0x0;
  local_88._0_8_ = (void *)0x0;
  local_88._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88._0_8_ = operator_new(0x10);
  *(TcpClient **)local_88._0_8_ = this_00;
  *(undefined8 *)(local_88._0_8_ + 8) = uVar4;
  p_Stack_70 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/tcp_relayer.cpp:26:59)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/tcp_relayer.cpp:26:59)>
             ::_M_manager;
  TVar6 = Liby::TimerMixin::runAfter(&this_00->super_TimerMixin,&local_68,(BasicHandler *)local_88);
  if (local_78 != (_Manager_type)0x0) {
    (*local_78)((_Any_data *)local_88,(_Any_data *)local_88,__destroy_functor);
  }
  local_68.tv_.tv_sec = (__time_t)&PTR__RelayerContext_0012f1a0;
  local_68.tv_.tv_usec = 0;
  _Stack_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<Liby::Connection,void>
            ((__shared_ptr<Liby::Connection,(__gnu_cxx::_Lock_policy)2> *)local_88,
             (__weak_ptr<Liby::Connection,_(__gnu_cxx::_Lock_policy)2> *)
             &conn->super_enable_shared_from_this<Liby::Connection>);
  local_68.tv_.tv_usec = local_88._0_8_;
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&_Stack_58,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
  }
  _Var3._M_pi = _Stack_58._M_pi;
  _Var2 = local_68.tv_.tv_usec;
  if (_Stack_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Stack_58._M_pi)->_M_weak_count = (_Stack_58._M_pi)->_M_weak_count + 1;
      UNLOCK();
    }
    else {
      (_Stack_58._M_pi)->_M_weak_count = (_Stack_58._M_pi)->_M_weak_count + 1;
    }
  }
  local_78 = (_Manager_type)0x0;
  p_Stack_70 = (_Invoker_type)0x0;
  local_88._0_8_ = (void *)0x0;
  local_88._8_8_ = 0;
  local_88._0_8_ = operator_new(0x28);
  *(TcpRelayer **)local_88._0_8_ = this;
  *(undefined ***)(local_88._0_8_ + 8) = &PTR__RelayerContext_0012f1a0;
  *(__suseconds_t *)(local_88._0_8_ + 0x10) = _Var2;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_88._0_8_ + 0x18) = _Var3._M_pi;
  *(TimerId *)(local_88._0_8_ + 0x20) = TVar6;
  p_Stack_70 = std::
               _Function_handler<void_(std::shared_ptr<Liby::Connection>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/tcp_relayer.cpp:30:30)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(std::shared_ptr<Liby::Connection>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/examples/tcp_relayer.cpp:30:30)>
             ::_M_manager;
  Liby::TcpClient::onConnect(local_50,(Connector *)local_88);
  if (local_78 != (_Manager_type)0x0) {
    (*local_78)((_Any_data *)local_88,(_Any_data *)local_88,__destroy_functor);
  }
  local_68.tv_.tv_sec = (__time_t)&PTR__RelayerContext_0012f1a0;
  if (_Stack_58._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var1 = &(_Stack_58._M_pi)->_M_weak_count;
      iVar5 = *p_Var1;
      *p_Var1 = *p_Var1 + -1;
      UNLOCK();
    }
    else {
      iVar5 = (_Stack_58._M_pi)->_M_weak_count;
      (_Stack_58._M_pi)->_M_weak_count = iVar5 + -1;
    }
    if (iVar5 == 1) {
      (*(_Stack_58._M_pi)->_vptr__Sp_counted_base[3])();
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_unused._0_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48._M_unused._0_8_);
  }
  return;
}

Assistant:

void onAccept(Connection &conn) {
        shared_ptr<TcpClient> tcpClient =
            group_.creatTcpClient(host_, service_);
        TimerId id = tcpClient->runAfter(Timestamp(8, 0), [tcpClient] {});

        RelayerContext context;
        context.weak_conn = conn.shared_from_this();
        tcpClient->onConnect([this, context, id](shared_ptr<Connection> c) {
            if (c && !context.weak_conn.expired()) {
                RelayerContext context1;
                context1.weak_conn = c;
                c->context_ = make_shared<RelayerContext>(context);
                auto c1 = context.weak_conn.lock();
                c1->context_ = make_shared<RelayerContext>(context1);

                c->onRead(
                    [this](Connection &connection) { onRead(connection); });
                c->onErro(
                    [this](Connection &connection) { onErro(connection); });
                c1->onRead(
                    [this](Connection &connection) { onRead(connection); });
                c1->onErro(
                    [this](Connection &connection) { onErro(connection); });
                c->enableRead();
                c1->enableRead();

                return;
            }

            if (c) {
                c->destroy();
            }

            if (!context.weak_conn.expired()) {
                context.weak_conn.lock()->destroy();
            }
        });
    }